

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O0

int run_test_tcp_create_early(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined4 local_12c;
  int local_128;
  int namelen;
  int r;
  uv_os_fd_t fd;
  uv_tcp_t client;
  sockaddr_in sockname;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,sockname.sin_zero);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x65,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  uVar2 = uv_default_loop();
  local_128 = uv_tcp_init_ex(uVar2,&r,2);
  if (local_128 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x68,"r == 0");
    abort();
  }
  local_128 = uv_fileno(&r,&namelen);
  if (local_128 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x6b,"r == 0");
    abort();
  }
  if (namelen == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x6c,"fd != INVALID_FD");
    abort();
  }
  local_12c = 0x10;
  local_128 = uv_tcp_getsockname(&r,&client.queued_fds,&local_12c);
  if (local_128 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x72,"r == 0");
    abort();
  }
  if ((short)client.queued_fds != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x73,"sockname.sin_family == AF_INET");
    abort();
  }
  local_128 = uv_tcp_bind(&r,sockname.sin_zero,0);
  if (local_128 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x77,"r == 0");
    abort();
  }
  local_12c = 0x10;
  local_128 = uv_tcp_getsockname(&r,&client.queued_fds,&local_12c);
  if (local_128 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x7b,"r == 0");
    abort();
  }
  if (sockname.sin_zero._4_4_ != client.queued_fds._4_4_) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x7e,"memcmp(&addr.sin_addr, &sockname.sin_addr, sizeof(addr.sin_addr)) == 0");
    abort();
  }
  uv_close(&r,0);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x83,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(tcp_create_early) {
  struct sockaddr_in addr;
  struct sockaddr_in sockname;
  uv_tcp_t client;
  uv_os_fd_t fd;
  int r, namelen;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init_ex(uv_default_loop(), &client, AF_INET);
  ASSERT(r == 0);

  r = uv_fileno((const uv_handle_t*) &client, &fd);
  ASSERT(r == 0);
  ASSERT(fd != INVALID_FD);

  /* Windows returns WSAEINVAL if the socket is not bound */
#ifndef _WIN32
  namelen = sizeof sockname;
  r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
  ASSERT(r == 0);
  ASSERT(sockname.sin_family == AF_INET);
#endif

  r = uv_tcp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  namelen = sizeof sockname;
  r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
  ASSERT(r == 0);
  ASSERT(memcmp(&addr.sin_addr,
                &sockname.sin_addr,
                sizeof(addr.sin_addr)) == 0);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}